

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetSparseImageSetDimensions(IceTSparseImage image,IceTSizeType width,IceTSizeType height)

{
  IceTSizeType height_local;
  IceTSizeType width_local;
  IceTSparseImage image_local;
  
  if (image.opaque_internals == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Cannot set number of pixels on null image.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x25a);
  }
  else if (*(int *)((long)image.opaque_internals + 0x14) < width * height) {
    icetRaiseDiagnostic("Cannot set an image size to greater than what the image was originally created."
                        ,0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x261);
  }
  else {
    *(IceTSizeType *)((long)image.opaque_internals + 0xc) = width;
    *(IceTSizeType *)((long)image.opaque_internals + 0x10) = height;
    icetClearSparseImage(image);
  }
  return;
}

Assistant:

void icetSparseImageSetDimensions(IceTSparseImage image,
                                  IceTSizeType width,
                                  IceTSizeType height)
{
    ICET_TEST_SPARSE_IMAGE_HEADER(image);

    if (image.opaque_internals == NULL) {
        icetRaiseError("Cannot set number of pixels on null image.",
                       ICET_INVALID_VALUE);
        return;
    }

    if (   width*height
         > ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAX_NUM_PIXELS_INDEX] ){
        icetRaiseError("Cannot set an image size to greater than what the"
                       " image was originally created.", ICET_INVALID_VALUE);
        return;
    }

    ICET_IMAGE_HEADER(image)[ICET_IMAGE_WIDTH_INDEX] = (IceTInt)width;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_HEIGHT_INDEX] = (IceTInt)height;

  /* Make sure the runlengths are valid. */
    icetClearSparseImage(image);
}